

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma2_decoder.c
# Opt level: O0

lzma_ret lzma2_decoder_init(lzma_lz_decoder_conflict *lz,lzma_allocator *allocator,void *opt,
                           lzma_lz_options *lz_options)

{
  lzma_ret lVar1;
  lzma_coder_conflict6 *plVar2;
  _Bool local_39;
  lzma_options_lzma *options;
  lzma_lz_options *lz_options_local;
  void *opt_local;
  lzma_allocator *allocator_local;
  lzma_lz_decoder_conflict *lz_local;
  
  if (lz->coder == (lzma_coder_conflict6 *)0x0) {
    plVar2 = (lzma_coder_conflict6 *)lzma_alloc(0xb8,allocator);
    lz->coder = plVar2;
    if (lz->coder == (lzma_coder_conflict6 *)0x0) {
      return LZMA_MEM_ERROR;
    }
    lz->code = lzma2_decode;
    lz->end = lzma2_decoder_end;
    memcpy(&lz->coder->lzma,&LZMA_LZ_DECODER_INIT,0x28);
  }
  lz->coder->sequence = SEQ_CONTROL;
  lz->coder->need_properties = true;
  local_39 = true;
  if (*(long *)((long)opt + 8) != 0) {
    local_39 = *(int *)((long)opt + 0x10) == 0;
  }
  lz->coder->need_dictionary_reset = local_39;
  lVar1 = lzma_lzma_decoder_create
                    ((lzma_lz_decoder_conflict1 *)&lz->coder->lzma,allocator,opt,lz_options);
  return lVar1;
}

Assistant:

static lzma_ret
lzma2_decoder_init(lzma_lz_decoder *lz, lzma_allocator *allocator,
		const void *opt, lzma_lz_options *lz_options)
{
	const lzma_options_lzma *options = opt;

	if (lz->coder == NULL) {
		lz->coder = lzma_alloc(sizeof(lzma_coder), allocator);
		if (lz->coder == NULL)
			return LZMA_MEM_ERROR;

		lz->code = &lzma2_decode;
		lz->end = &lzma2_decoder_end;

		lz->coder->lzma = LZMA_LZ_DECODER_INIT;
	}

	lz->coder->sequence = SEQ_CONTROL;
	lz->coder->need_properties = true;
	lz->coder->need_dictionary_reset = options->preset_dict == NULL
			|| options->preset_dict_size == 0;

	return lzma_lzma_decoder_create(&lz->coder->lzma,
			allocator, options, lz_options);
}